

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

any __thiscall OpenMD::SelectionCompiler::valuePeek(SelectionCompiler *this)

{
  long lVar1;
  _Storage _Var2;
  _Storage extraout_RDX;
  long in_RSI;
  any aVar3;
  
  lVar1 = *(long *)(in_RSI + 0x120) - *(long *)(in_RSI + 0x118);
  _Var2._M_ptr = (void *)(lVar1 % 0x18);
  if (*(long *)(in_RSI + 0x130) == lVar1 / 0x18) {
    (this->filename)._M_dataplus._M_p = (pointer)0x0;
    (this->filename)._M_string_length = 0;
  }
  else {
    std::any::any((any *)this,
                  (any *)(*(long *)(in_RSI + 0x118) + *(long *)(in_RSI + 0x130) * 0x18 + 8));
    _Var2 = extraout_RDX;
  }
  aVar3._M_storage._M_ptr = _Var2._M_ptr;
  aVar3._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)this;
  return aVar3;
}

Assistant:

std::any SelectionCompiler::valuePeek() {
    if (itokenInfix == atokenInfix.size()) {
      return std::any();
    } else {
      return atokenInfix[itokenInfix].value;
    }
  }